

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_indexed_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_75d24::CpuAbsoluteIndexedTest_slo_absy_sets_c_without_pagecrossing_Test::TestBody
          (CpuAbsoluteIndexedTest_slo_absy_sets_c_without_pagecrossing_Test *this)

{
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.registers.p = '\x02';
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.registers.a = 'p';
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.expected.a = 'r';
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.expected.p = '\x01';
  (this->super_CpuAbsoluteIndexedTest).super_CpuTest.field_0x114 = 0x81;
  CpuAbsoluteIndexedTest::run_readwrite_instruction_without_pagecrossing
            (&this->super_CpuAbsoluteIndexedTest,'\x1b',Y,'\x02');
  return;
}

Assistant:

TEST_F(CpuAbsoluteIndexedTest, slo_absy_sets_c_without_pagecrossing) {
    registers.p = Z_FLAG;
    registers.a = 0b01110000;
    expected.a = 0b01110010;
    expected.p = C_FLAG;
    memory_content = 0b10000001;
    run_readwrite_instruction_without_pagecrossing(
            SLO_ABSY, IndexReg::Y, 0b00000010);
}